

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImGui::RenderRectFilledWithHole
               (ImDrawList *draw_list,ImRect *outer,ImRect *inner,ImU32 col,float rounding)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  ImVec2 local_30;
  ImVec2 local_28;
  
  fVar1 = (inner->Min).x;
  fVar2 = (inner->Min).y;
  fVar3 = (outer->Min).x;
  fVar4 = (outer->Min).y;
  fVar5 = (inner->Max).x;
  fVar6 = (outer->Max).x;
  fVar7 = (inner->Max).y;
  fVar8 = (outer->Max).y;
  if (fVar3 < fVar1) {
    local_28.y = fVar2;
    local_28.x = fVar3;
    local_30.y = fVar7;
    local_30.x = fVar1;
    ImDrawList::AddRectFilled
              (draw_list,&local_28,&local_30,col,rounding,
               (uint)(fVar2 <= fVar4) * 0x10 + (uint)(fVar8 <= fVar7) * 0x40 + 0x100);
  }
  if (fVar5 < fVar6) {
    uVar9 = *(undefined8 *)&(inner->Min).y;
    local_28.y = (float)uVar9;
    local_28.x = (float)((ulong)uVar9 >> 0x20);
    local_30.y = (inner->Max).y;
    local_30.x = (outer->Max).x;
    ImDrawList::AddRectFilled
              (draw_list,&local_28,&local_30,col,rounding,
               (uint)(fVar2 <= fVar4) * 0x20 + (uint)(fVar8 <= fVar7) * 0x80 + 0x100);
  }
  if (fVar4 < fVar2) {
    local_28.y = (outer->Min).y;
    local_28.x = (inner->Min).x;
    uVar9 = *(undefined8 *)&(inner->Min).y;
    local_30.y = (float)uVar9;
    local_30.x = (float)((ulong)uVar9 >> 0x20);
    ImDrawList::AddRectFilled
              (draw_list,&local_28,&local_30,col,rounding,
               (uint)(fVar1 <= fVar3) * 0x10 + (uint)(fVar6 <= fVar5) * 0x20 + 0x100);
  }
  if (fVar7 < fVar8) {
    local_28.y = (inner->Max).y;
    local_28.x = (inner->Min).x;
    local_30.y = (outer->Max).y;
    local_30.x = (inner->Max).x;
    ImDrawList::AddRectFilled
              (draw_list,&local_28,&local_30,col,rounding,
               (uint)(fVar1 <= fVar3) * 0x40 + (uint)(fVar6 <= fVar5) * 0x80 + 0x100);
  }
  if ((fVar3 < fVar1) && (fVar4 < fVar2)) {
    local_28 = outer->Min;
    local_30 = inner->Min;
    ImDrawList::AddRectFilled(draw_list,&local_28,&local_30,col,rounding,0x10);
  }
  if ((fVar5 < fVar6) && (fVar4 < fVar2)) {
    local_28.y = (outer->Min).y;
    local_28.x = (inner->Max).x;
    local_30.y = (inner->Min).y;
    local_30.x = (outer->Max).x;
    ImDrawList::AddRectFilled(draw_list,&local_28,&local_30,col,rounding,0x20);
  }
  if ((fVar3 < fVar1) && (fVar7 < fVar8)) {
    local_28.y = (inner->Max).y;
    local_28.x = (outer->Min).x;
    local_30.y = (outer->Max).y;
    local_30.x = (inner->Min).x;
    ImDrawList::AddRectFilled(draw_list,&local_28,&local_30,col,rounding,0x40);
  }
  if ((fVar5 < fVar6) && (fVar7 < fVar8)) {
    local_28 = inner->Max;
    local_30 = outer->Max;
    ImDrawList::AddRectFilled(draw_list,&local_28,&local_30,col,rounding,0x80);
  }
  return;
}

Assistant:

void ImGui::RenderRectFilledWithHole(ImDrawList* draw_list, const ImRect& outer, const ImRect& inner, ImU32 col, float rounding)
{
    const bool fill_L = (inner.Min.x > outer.Min.x);
    const bool fill_R = (inner.Max.x < outer.Max.x);
    const bool fill_U = (inner.Min.y > outer.Min.y);
    const bool fill_D = (inner.Max.y < outer.Max.y);
    if (fill_L) draw_list->AddRectFilled(ImVec2(outer.Min.x, inner.Min.y), ImVec2(inner.Min.x, inner.Max.y), col, rounding, ImDrawFlags_RoundCornersNone | (fill_U ? 0 : ImDrawFlags_RoundCornersTopLeft)    | (fill_D ? 0 : ImDrawFlags_RoundCornersBottomLeft));
    if (fill_R) draw_list->AddRectFilled(ImVec2(inner.Max.x, inner.Min.y), ImVec2(outer.Max.x, inner.Max.y), col, rounding, ImDrawFlags_RoundCornersNone | (fill_U ? 0 : ImDrawFlags_RoundCornersTopRight)   | (fill_D ? 0 : ImDrawFlags_RoundCornersBottomRight));
    if (fill_U) draw_list->AddRectFilled(ImVec2(inner.Min.x, outer.Min.y), ImVec2(inner.Max.x, inner.Min.y), col, rounding, ImDrawFlags_RoundCornersNone | (fill_L ? 0 : ImDrawFlags_RoundCornersTopLeft)    | (fill_R ? 0 : ImDrawFlags_RoundCornersTopRight));
    if (fill_D) draw_list->AddRectFilled(ImVec2(inner.Min.x, inner.Max.y), ImVec2(inner.Max.x, outer.Max.y), col, rounding, ImDrawFlags_RoundCornersNone | (fill_L ? 0 : ImDrawFlags_RoundCornersBottomLeft) | (fill_R ? 0 : ImDrawFlags_RoundCornersBottomRight));
    if (fill_L && fill_U) draw_list->AddRectFilled(ImVec2(outer.Min.x, outer.Min.y), ImVec2(inner.Min.x, inner.Min.y), col, rounding, ImDrawFlags_RoundCornersTopLeft);
    if (fill_R && fill_U) draw_list->AddRectFilled(ImVec2(inner.Max.x, outer.Min.y), ImVec2(outer.Max.x, inner.Min.y), col, rounding, ImDrawFlags_RoundCornersTopRight);
    if (fill_L && fill_D) draw_list->AddRectFilled(ImVec2(outer.Min.x, inner.Max.y), ImVec2(inner.Min.x, outer.Max.y), col, rounding, ImDrawFlags_RoundCornersBottomLeft);
    if (fill_R && fill_D) draw_list->AddRectFilled(ImVec2(inner.Max.x, inner.Max.y), ImVec2(outer.Max.x, outer.Max.y), col, rounding, ImDrawFlags_RoundCornersBottomRight);
}